

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.h
# Opt level: O3

void features::Matching::oneway_match<float>
               (Options *options,float *set_1,int set_1_size,float *set_2,int set_2_size,
               vector<int,_std::allocator<int>_> *result)

{
  int *piVar1;
  pointer piVar2;
  iterator __position;
  value_type_conflict2 *__x;
  char *this;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_60 [8];
  Result nn_result;
  NearestNeighbor<float> local_48;
  int local_38;
  float local_34;
  
  piVar2 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_48.dimensions = -1;
  nn_result._8_8_ = set_2;
  local_38 = set_2_size;
  std::vector<int,_std::allocator<int>_>::resize(result,(long)set_1_size,&local_48.dimensions);
  if (local_38 != 0 && set_1_size != 0) {
    local_48.elements = (float *)nn_result._8_8_;
    local_48.num_elements = local_38;
    local_48.dimensions = options->descriptor_length;
    if (0 < set_1_size) {
      local_34 = options->distance_threshold * options->distance_threshold;
      uVar4 = 0;
      do {
        NearestNeighbor<float>::find
                  (&local_48,set_1 + (long)(int)uVar4 * (long)options->descriptor_length,
                   (Result *)local_60);
        if ((float)local_60._0_4_ <= local_34) {
          piVar2 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar4) {
            this = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            piVar2 = (((vector<int,_std::allocator<int>_> *)this)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            __position._M_current =
                 (((vector<int,_std::allocator<int>_> *)this)->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
            uVar3 = (long)__position._M_current - (long)piVar2 >> 2;
            if (uVar4 >= uVar3 && uVar4 - uVar3 != 0) {
              std::vector<int,_std::allocator<int>_>::_M_fill_insert
                        ((vector<int,_std::allocator<int>_> *)this,__position,uVar4 - uVar3,__x);
              return;
            }
            if ((uVar4 < uVar3) && (piVar1 = piVar2 + uVar4, __position._M_current != piVar1)) {
              (((vector<int,_std::allocator<int>_> *)this)->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = piVar1;
            }
            return;
          }
          piVar2[uVar4] = (int)nn_result.dist_1st_best;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)set_1_size != uVar4);
    }
  }
  return;
}

Assistant:

void
Matching::oneway_match (Options const& options,
    T const* set_1, int set_1_size,
    T const* set_2, int set_2_size,
    std::vector<int>* result)
{
    result->clear();
    result->resize(set_1_size, -1);
    if (set_1_size == 0 || set_2_size == 0)
        return;

    // 与最近邻距离的阈值
    float const square_dist_thres = MATH_POW2(options.distance_threshold);

    // 以描述子为特征，计算每个特征点的最近邻和次近邻
    NearestNeighbor<T> nn;
    nn.set_elements(set_2);
    // 特征点的个数
    nn.set_num_elements(set_2_size);
    // 设置特征描述子的维度 sift 128, surf 64
    nn.set_element_dimensions(options.descriptor_length);

    for (int i = 0; i < set_1_size; ++i)
    {
        // 每个特征点最近邻搜索的结果
        typename NearestNeighbor<T>::Result nn_result;

        // feature sets 1 中第i个特征点的特征描述子
        T const* query_pointer = set_1 + i * options.descriptor_length;

        // 计算最近邻
        nn.find(query_pointer, &nn_result);

        // 标准1： 与最近邻的距离必须小于特定阈值
        if (nn_result.dist_1st_best > square_dist_thres)
            continue;




        /***********************task2*************************************/
        // 标准2： 与最近邻和次紧邻的距离比必须小于特定阈值
        /*
         * 参考标准1的形式给出lowe-ratio约束
         */
        float square_dist_1st_best = static_cast<float>(nn_result.dist_1st_best);
        float square_dist_2st_best = static_cast<float>(nn_result.dist_2nd_best);
        float const square_lowe_thres = MATH_POW2(options.lowe_ratio_threshold);

               /*                  */
               /*    此处添加代码    */
               /*                  */
        /*****************************************************************/





//        if (static_cast<float>(nn_result.dist_1st_best)
//            / static_cast<float>(nn_result.dist_2nd_best)
//            > square_lowe_thres)
//            continue;
        // 匹配成功，feature set1 中第i个特征值对应feature set2中的第index_1st_best个特征点
        result->at(i) = nn_result.index_1st_best;
    }
}